

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O2

word * Ssc_GiaGetCareMask(Gia_Man_t *p)

{
  int nWords;
  word *pSim;
  Gia_Obj_t *pObj;
  word *pSim1;
  int iVar1;
  int v;
  size_t __size;
  
  iVar1 = p->nRegs;
  nWords = p->vSimsPi->nSize / (p->vCis->nSize - iVar1);
  __size = (long)nWords << 3;
  pSim = (word *)malloc(__size);
  memset(pSim,0xff,__size);
  v = 0;
  while( true ) {
    if (p->vCos->nSize - iVar1 <= v) {
      return pSim;
    }
    pObj = Gia_ManCo(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    pSim1 = Gia_ObjSimObj(p,pObj);
    Ssc_SimAnd(pSim,pSim,pSim1,nWords,0,0);
    v = v + 1;
    iVar1 = p->nRegs;
  }
  return pSim;
}

Assistant:

word * Ssc_GiaGetCareMask( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, nWords = Gia_ObjSimWords( p );
    word * pRes = ABC_FALLOC( word, nWords );
    Gia_ManForEachPo( p, pObj, i )
        Ssc_SimAnd( pRes, pRes, Gia_ObjSimObj(p, pObj), nWords, 0, 0 );
    return pRes;
}